

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::accessibleTree2Index(QTreeViewPrivate *this,QModelIndex *index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QHeaderView *pQVar4;
  QAbstractItemModel *pQVar5;
  QModelIndex *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeView *q;
  QModelIndex *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  iVar1 = QTreeView::visualIndex
                    ((QTreeView *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  pQVar4 = QTreeView::header((QTreeView *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
  pQVar5 = QModelIndex::model((QModelIndex *)0x900e88);
  QModelIndex::QModelIndex((QModelIndex *)0x900e9c);
  iVar2 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,local_20);
  iVar3 = QModelIndex::column(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ((iVar1 + 1) - (uint)(pQVar4 == (QHeaderView *)0x0)) * iVar2 + iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeViewPrivate::accessibleTree2Index(const QModelIndex &index) const
{
    Q_Q(const QTreeView);

    // Note that this will include the header, even if its hidden.
    return (q->visualIndex(index) + (q->header() ? 1 : 0)) * index.model()->columnCount() + index.column();
}